

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_PolyEdgeHistoryValue::WriteHelper(ON_PolyEdgeHistoryValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  ON_PolyEdgeHistory *this_00;
  bool local_41;
  int local_28;
  int count;
  int i;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_PolyEdgeHistoryValue *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    iVar2 = ON_ClassArray<ON_PolyEdgeHistory>::Count(&this->m_value);
    count._3_1_ = ON_BinaryArchive::WriteInt(archive,iVar2);
    if (count._3_1_) {
      iVar2 = ON_ClassArray<ON_PolyEdgeHistory>::Count(&this->m_value);
      local_28 = 0;
      while( true ) {
        local_41 = false;
        if (local_28 < iVar2) {
          local_41 = count._3_1_;
        }
        if (local_41 == false) break;
        this_00 = ON_ClassArray<ON_PolyEdgeHistory>::operator[](&this->m_value,local_28);
        count._3_1_ = ON_PolyEdgeHistory::Write(this_00,archive);
        local_28 = local_28 + 1;
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      count._3_1_ = false;
    }
    this_local._7_1_ = count._3_1_;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyEdgeHistoryValue::WriteHelper(ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;

  for(;;)
  {
    rc = archive.WriteInt(m_value.Count());
    if (!rc) break;
    
    int i, count = m_value.Count();
    for( i = 0; i < count && rc; i++ )
    {
      rc = m_value[i].Write(archive);
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}